

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9ParseIniString(jx9_context *pCtx,char *zIn,sxu32 nByte,int bProcessSection)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  jx9_value *pjVar5;
  jx9_value *pVal;
  jx9_value *pVal_00;
  ushort **ppuVar6;
  ulong uVar7;
  SyHashEntry_Pr *pSVar8;
  jx9_value *pjVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  undefined4 in_register_0000000c;
  undefined8 uVar13;
  undefined8 extraout_RDX;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  uint uVar18;
  SyHash sHash;
  char *local_c8;
  jx9_value *local_c0;
  ulong local_b0;
  jx9_value *local_a8;
  SyHash local_70;
  
  uVar13 = CONCAT44(in_register_0000000c,bProcessSection);
  pjVar5 = jx9_context_new_array(pCtx);
  pVal = jx9_context_new_scalar(pCtx);
  pVal_00 = jx9_context_new_scalar(pCtx);
  bVar10 = pVal == (jx9_value *)0x0 || pjVar5 == (jx9_value *)0x0;
  if (pVal_00 == (jx9_value *)0x0 || (pVal == (jx9_value *)0x0 || pjVar5 == (jx9_value *)0x0)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"JX9 is running out of memory");
    pjVar5 = pCtx->pRet;
    jx9MemObjRelease(pjVar5);
    (pjVar5->x).rVal = 0.0;
    uVar4 = pjVar5->iFlags & 0xfffffe90U | 8;
    pjVar5->iFlags = uVar4;
  }
  else {
    SyHashInit(&local_70,&pCtx->pVm->sAllocator,
               (ProcHash)
               CONCAT71((int7)((ulong)extraout_RDX >> 8),pVal_00 == (jx9_value *)0x0 || bVar10),
               (ProcCmp)CONCAT71((int7)((ulong)uVar13 >> 8),bVar10));
    if (nByte != 0) {
      pcVar17 = zIn + nByte;
      local_a8 = pjVar5;
LAB_00136b98:
      do {
        cVar11 = *zIn;
        if (((ulong)(long)cVar11 < 0xffffffffffffffc0) &&
           (ppuVar6 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar6 + (long)cVar11 * 2 + 1) & 0x20) != 0)) {
          zIn = zIn + 1;
        }
        else {
          if ((cVar11 == ';') || (cVar11 == '#')) {
            do {
              zIn = zIn + 1;
              if (pcVar17 <= zIn) goto LAB_001372f7;
            } while (*zIn != '\n');
            goto LAB_00136b98;
          }
          (pVal->sBlob).nByte = 0;
          uVar4 = (pVal->sBlob).nFlags;
          if ((uVar4 & 4) != 0) {
            (pVal->sBlob).pBlob = (void *)0x0;
            (pVal->sBlob).mByte = 0;
            (pVal->sBlob).nFlags = uVar4 & 0xfffffffb;
          }
          cVar11 = *zIn;
          if (cVar11 == '[') {
            pcVar15 = zIn + 1;
            local_c8 = pcVar15;
            if (pcVar15 < pcVar17) {
              uVar14 = 1;
              do {
                uVar7 = uVar14;
                if (zIn[uVar14] == ']') break;
                lVar3 = uVar14 + 1;
                uVar14 = uVar14 + 1;
                uVar7 = (long)pcVar17 - (long)zIn;
              } while (zIn + lVar3 < pcVar17);
              local_c8 = zIn + uVar14;
              if ((bProcessSection != 0) && (1 < uVar7)) {
                uVar14 = (ulong)((int)uVar7 - 1);
                pcVar1 = pcVar15 + uVar14;
                do {
                  uVar7 = uVar14;
                  pcVar16 = pcVar1;
                  if (((int)uVar7 == 0) ||
                     (cVar11 = *pcVar15, pcVar16 = pcVar15, 0xffffffffffffffbf < (ulong)(long)cVar11
                     )) break;
                  pcVar16 = zIn + 1;
                  ppuVar6 = __ctype_b_loc();
                  pcVar15 = pcVar15 + 1;
                  uVar14 = uVar7 - 1;
                  zIn = pcVar16;
                } while ((*(byte *)((long)*ppuVar6 + (long)cVar11 * 2 + 1) & 0x20) != 0);
                do {
                  uVar14 = uVar7;
                  if (uVar14 == 0) {
                    jx9_value_string(pVal,pcVar16,0);
                    goto LAB_001371b9;
                  }
                  cVar11 = pcVar16[uVar14 - 1];
                } while (((ulong)(long)cVar11 < 0xffffffffffffffc0) &&
                        (ppuVar6 = __ctype_b_loc(), uVar7 = uVar14 - 1,
                        (*(byte *)((long)*ppuVar6 + (long)cVar11 * 2 + 1) & 0x20) != 0));
                jx9_value_string(pVal,pcVar16,(int)uVar14);
                pjVar9 = jx9_context_new_array(pCtx);
                if ((pjVar9 != (jx9_value *)0x0) &&
                   (local_a8 = pjVar9, (pjVar5->iFlags & 0x40) != 0)) {
                  HashmapInsert((jx9_hashmap *)(pjVar5->x).pOther,pVal,pjVar9);
                }
              }
            }
LAB_001371b9:
            zIn = local_c8 + 1;
            goto LAB_00136be7;
          }
          local_c8 = zIn;
          if (zIn < pcVar17) {
            if (cVar11 == '=') {
              uVar4 = 0;
              bVar10 = true;
              local_c0 = local_a8;
            }
            else {
              bVar10 = false;
              local_c0 = local_a8;
              uVar4 = 0;
              do {
                if (!bVar10 && cVar11 == '[') {
                  uVar4 = (int)local_c8 - (int)zIn;
                  pcVar15 = zIn;
                  uVar18 = uVar4;
                  if (0 < (int)uVar4) {
                    do {
                      cVar11 = *pcVar15;
                      if ((0xffffffffffffffbf < (ulong)(long)cVar11) ||
                         (ppuVar6 = __ctype_b_loc(),
                         (*(byte *)((long)*ppuVar6 + (long)cVar11 * 2 + 1) & 0x20) == 0))
                      goto LAB_00136d9f;
                      pcVar15 = pcVar15 + 1;
                      uVar18 = uVar18 - 1;
                    } while (uVar18 != 0);
                    uVar18 = 0;
LAB_00136d9f:
                    uVar14 = (ulong)uVar18;
                    do {
                      local_b0 = uVar14;
                      if (local_b0 == 0) {
                        local_b0 = 0;
                        goto LAB_00136e25;
                      }
                      cVar11 = pcVar15[local_b0 - 1];
                    } while (((ulong)(long)cVar11 < 0xffffffffffffffc0) &&
                            (ppuVar6 = __ctype_b_loc(), uVar14 = local_b0 - 1,
                            (*(byte *)((long)*ppuVar6 + (long)cVar11 * 2 + 1) & 0x20) != 0));
                    if ((local_70.nEntry == 0) ||
                       (pSVar8 = HashGetEntry(&local_70,pcVar15,(sxu32)local_b0),
                       pSVar8 == (SyHashEntry_Pr *)0x0)) {
LAB_00136e25:
                      pjVar9 = jx9_context_new_array(pCtx);
                      if (pjVar9 == (jx9_value *)0x0) {
                        pjVar9 = (jx9_value *)0x0;
                      }
                      else {
                        SyHashInsert(&local_70,pcVar15,(sxu32)local_b0,pjVar9);
                        (pVal->sBlob).nByte = 0;
                        uVar18 = (pVal->sBlob).nFlags;
                        if ((uVar18 & 4) != 0) {
                          (pVal->sBlob).pBlob = (void *)0x0;
                          (pVal->sBlob).mByte = 0;
                          (pVal->sBlob).nFlags = uVar18 & 0xfffffffb;
                        }
                        jx9_value_string(pVal,pcVar15,(sxu32)local_b0);
                        if ((local_c0->iFlags & 0x40) != 0) {
                          HashmapInsert((jx9_hashmap *)(local_c0->x).pOther,pVal,pjVar9);
                        }
                        (pVal->sBlob).nByte = 0;
                        uVar18 = (pVal->sBlob).nFlags;
                        if ((uVar18 & 4) != 0) {
                          (pVal->sBlob).pBlob = (void *)0x0;
                          (pVal->sBlob).mByte = 0;
                          (pVal->sBlob).nFlags = uVar18 & 0xfffffffb;
                        }
                      }
                    }
                    else {
                      pjVar9 = (jx9_value *)pSVar8->pUserData;
                    }
                    if (pjVar9 != (jx9_value *)0x0) {
                      local_c0 = pjVar9;
                    }
                  }
                  do {
                    bVar10 = true;
                    if (*local_c8 == ']') break;
                    local_c8 = local_c8 + 1;
                  } while (local_c8 < pcVar17);
                }
                local_c8 = local_c8 + 1;
              } while ((local_c8 < pcVar17) && (cVar11 = *local_c8, cVar11 != '='));
              bVar10 = !bVar10;
            }
            uVar18 = (int)local_c8 - (int)zIn;
            if (!bVar10) {
              uVar18 = uVar4;
            }
            if (uVar18 == 0) goto LAB_00136f74;
            pcVar15 = zIn + (ulong)(uVar18 - 1) + 1;
            do {
              cVar11 = *zIn;
              if ((0xffffffffffffffbf < (ulong)(long)cVar11) ||
                 (ppuVar6 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar6 + (long)cVar11 * 2 + 1) & 0x20) == 0)) goto LAB_00136f7c;
              zIn = zIn + 1;
              uVar18 = uVar18 - 1;
            } while (uVar18 != 0);
            uVar18 = 0;
            zIn = pcVar15;
LAB_00136f7c:
            uVar14 = (ulong)uVar18;
          }
          else {
            bVar10 = true;
            local_c0 = local_a8;
LAB_00136f74:
            uVar14 = 0;
          }
          do {
            uVar7 = uVar14;
            if (uVar7 == 0) {
              zIn = local_c8;
              if (local_c8 < pcVar17) goto LAB_001370d6;
              goto LAB_00136be7;
            }
            cVar11 = zIn[uVar7 - 1];
          } while (((ulong)(long)cVar11 < 0xffffffffffffffc0) &&
                  (ppuVar6 = __ctype_b_loc(), uVar14 = uVar7 - 1,
                  (*(byte *)((long)*ppuVar6 + (long)cVar11 * 2 + 1) & 0x20) != 0));
          if (bVar10) {
            jx9_value_string(pVal,zIn,(int)uVar7);
          }
          (pVal_00->sBlob).nByte = 0;
          uVar4 = (pVal_00->sBlob).nFlags;
          if ((uVar4 & 4) != 0) {
            (pVal_00->sBlob).pBlob = (void *)0x0;
            (pVal_00->sBlob).mByte = 0;
            (pVal_00->sBlob).nFlags = uVar4 & 0xfffffffb;
          }
          iVar12 = (int)local_c8;
          pcVar15 = local_c8 + 3;
          do {
            pcVar1 = local_c8;
            pcVar16 = pcVar15;
            local_c8 = pcVar1 + 1;
            iVar12 = iVar12 + 1;
            zIn = local_c8;
            if (pcVar17 <= local_c8) goto LAB_00136be7;
            cVar11 = *local_c8;
            if (0xffffffffffffffbf < (ulong)(long)cVar11) break;
            ppuVar6 = __ctype_b_loc();
            pcVar15 = pcVar16 + 1;
          } while ((*(byte *)((long)*ppuVar6 + (long)cVar11 * 2 + 1) & 0x20) != 0);
          if ((cVar11 == '\"') || (cVar11 == '\'')) {
            zIn = pcVar1 + 2;
            for (; (zIn < pcVar17 &&
                   ((zIn = pcVar16, pcVar16[-1] != cVar11 || (pcVar16[-2] == '\\'))));
                pcVar16 = pcVar16 + 1) {
            }
          }
          else {
            do {
              cVar2 = *zIn;
              if (cVar2 == '\n') {
                if (zIn[-1] != '\\') break;
              }
              else if ((cVar2 == '#') || (cVar2 == ';')) break;
              zIn = zIn + 1;
            } while (zIn < pcVar17);
          }
          uVar4 = (int)zIn - iVar12;
          if (uVar4 == 0) {
            uVar14 = 0;
          }
          else {
            do {
              cVar2 = *local_c8;
              if ((0xffffffffffffffbf < (ulong)(long)cVar2) ||
                 (ppuVar6 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar6 + (long)cVar2 * 2 + 1) & 0x20) == 0)) goto LAB_00137218;
              local_c8 = local_c8 + 1;
              uVar4 = uVar4 - 1;
            } while (uVar4 != 0);
            uVar4 = 0;
LAB_00137218:
            uVar14 = (ulong)uVar4;
          }
          uVar4 = ~(uint)uVar14;
          do {
            if (uVar14 == 0) {
              uVar14 = 0;
              goto LAB_00137265;
            }
            cVar2 = local_c8[uVar14 - 1];
            if (0xffffffffffffffbf < (ulong)(long)cVar2) goto LAB_00137265;
            ppuVar6 = __ctype_b_loc();
            uVar4 = uVar4 + 1;
            uVar14 = uVar14 - 1;
          } while ((*(byte *)((long)*ppuVar6 + (long)cVar2 * 2 + 1) & 0x20) != 0);
          uVar14 = (ulong)-uVar4;
LAB_00137265:
          iVar12 = (int)uVar14;
          if ((cVar11 == '\'') || (cVar11 == '\"')) {
            if (iVar12 == 0) {
              uVar14 = 0;
            }
            else {
              pcVar15 = local_c8 + (ulong)(iVar12 - 1) + 1;
              do {
                if (*local_c8 != cVar11) goto LAB_0013729c;
                local_c8 = local_c8 + 1;
                uVar4 = (int)uVar14 - 1;
                uVar14 = (ulong)uVar4;
              } while (uVar4 != 0);
              uVar14 = 0;
              local_c8 = pcVar15;
LAB_0013729c:
              uVar14 = uVar14 & 0xffffffff;
            }
            iVar12 = (int)uVar14 + 1;
            do {
              if (uVar14 == 0) goto LAB_001372ca;
              iVar12 = iVar12 + -1;
              lVar3 = uVar14 - 1;
              uVar14 = uVar14 - 1;
            } while (local_c8[lVar3] == cVar11);
LAB_001372c0:
            jx9_value_string(pVal_00,local_c8,iVar12);
          }
          else if (iVar12 != 0) goto LAB_001372c0;
LAB_001372ca:
          if ((local_c0->iFlags & 0x40) != 0) {
            pjVar9 = (jx9_value *)0x0;
            if (bVar10) {
              pjVar9 = pVal;
            }
            HashmapInsert((jx9_hashmap *)(local_c0->x).pOther,pjVar9,pVal_00);
          }
        }
LAB_00136be7:
      } while (zIn < pcVar17);
    }
LAB_001372f7:
    SyHashRelease(&local_70);
    uVar4 = jx9_result_value(pCtx,pjVar5);
  }
  return uVar4;
LAB_001370d6:
  cVar11 = *local_c8;
  zIn = local_c8;
  if (0xffffffffffffffbf < (ulong)(long)cVar11) goto LAB_00136be7;
  ppuVar6 = __ctype_b_loc();
  if (((cVar11 != '=') && (((*ppuVar6)[cVar11] & 0x2000) == 0)) ||
     (local_c8 = local_c8 + 1, zIn = local_c8, pcVar17 <= local_c8)) goto LAB_00136be7;
  goto LAB_001370d6;
}

Assistant:

JX9_PRIVATE sxi32 jx9ParseIniString(jx9_context *pCtx, const char *zIn, sxu32 nByte, int bProcessSection)
{
	jx9_value *pCur, *pArray, *pSection, *pWorker, *pValue;
	const char *zCur, *zEnd = &zIn[nByte];
	SyHashEntry *pEntry;
	SyString sEntry;
	SyHash sHash;
	int c;
	/* Create an empty array and worker variables */
	pArray = jx9_context_new_array(pCtx);
	pWorker = jx9_context_new_scalar(pCtx);
	pValue = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pWorker == 0 || pValue == 0){
		/* Out of memory */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		/* Return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	SyHashInit(&sHash, &pCtx->pVm->sAllocator, 0, 0);
	pCur = pArray;
	/* Start the parse process */
	for(;;){
		/* Ignore leading white spaces */
		while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0])){
			zIn++;
		}
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		if( zIn[0] == ';' || zIn[0] == '#' ){
			/* Comment til the end of line */
			zIn++;
			while(zIn < zEnd && zIn[0] != '\n' ){
				zIn++;
			}
			continue;
		}
		/* Reset the string cursor of the working variable */
		jx9_value_reset_string_cursor(pWorker);
		if( zIn[0] == '[' ){
			/* Section: Extract the section name */
			zIn++;
			zCur = zIn;
			while( zIn < zEnd && zIn[0] != ']' ){
				zIn++;
			}
			if( zIn > zCur && bProcessSection ){
				/* Save the section name */
				SyStringInitFromBuf(&sEntry, zCur, (int)(zIn-zCur));
				SyStringFullTrim(&sEntry);
				jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
				if( sEntry.nByte > 0 ){
					/* Associate an array with the section */
					pSection = jx9_context_new_array(pCtx);
					if( pSection ){
						jx9_array_add_elem(pArray, pWorker/*Section name*/, pSection);
						pCur = pSection;
					}
				}
			}
			zIn++; /* Trailing square brackets ']' */
		}else{
			jx9_value *pOldCur;
			int is_array;
			int iLen;
			/* Properties */
			is_array = 0;
			zCur = zIn;
			iLen = 0; /* cc warning */
			pOldCur = pCur;
			while( zIn < zEnd && zIn[0] != '=' ){
				if( zIn[0] == '[' && !is_array ){
					/* Array */
					iLen = (int)(zIn-zCur);
					is_array = 1;
					if( iLen > 0 ){
						jx9_value *pvArr = 0; /* cc warning */
						/* Query the hashtable */
						SyStringInitFromBuf(&sEntry, zCur, iLen);
						SyStringFullTrim(&sEntry);
						pEntry = SyHashGet(&sHash, (const void *)sEntry.zString, sEntry.nByte);
						if( pEntry ){
							pvArr = (jx9_value *)SyHashEntryGetUserData(pEntry);
						}else{
							/* Create an empty array */
							pvArr = jx9_context_new_array(pCtx);
							if( pvArr ){
								/* Save the entry */
								SyHashInsert(&sHash, (const void *)sEntry.zString, sEntry.nByte, pvArr);
								/* Insert the entry */
								jx9_value_reset_string_cursor(pWorker);
								jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
								jx9_array_add_elem(pCur, pWorker, pvArr);
								jx9_value_reset_string_cursor(pWorker);
							}
						}
						if( pvArr ){
							pCur = pvArr;
						}
					}
					while ( zIn < zEnd && zIn[0] != ']' ){
						zIn++;
					}
				}
				zIn++;
			}
			if( !is_array ){
				iLen = (int)(zIn-zCur);
			}
			/* Trim the key */
			SyStringInitFromBuf(&sEntry, zCur, iLen);
			SyStringFullTrim(&sEntry);
			if( sEntry.nByte > 0 ){
				if( !is_array ){
					/* Save the key name */
					jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
				}
				/* extract key value */
				jx9_value_reset_string_cursor(pValue);
				zIn++; /* '=' */
				while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
					zIn++;
				}
				if( zIn < zEnd ){
					zCur = zIn;
					c = zIn[0];
					if( c == '"' || c == '\'' ){
						zIn++;
						/* Delimit the value */
						while( zIn < zEnd ){
							if ( zIn[0] == c && zIn[-1] != '\\' ){
								break;
							}
							zIn++;
						}
						if( zIn < zEnd ){
							zIn++;
						}
					}else{
						while( zIn < zEnd ){
							if( zIn[0] == '\n' ){
								if( zIn[-1] != '\\' ){
									break;
								}
							}else if( zIn[0] == ';' || zIn[0] == '#' ){
								/* Inline comments */
								break;
							}
							zIn++;
						}
					}
					/* Trim the value */
					SyStringInitFromBuf(&sEntry, zCur, (int)(zIn-zCur));
					SyStringFullTrim(&sEntry);
					if( c == '"' || c == '\'' ){
						SyStringTrimLeadingChar(&sEntry, c);
						SyStringTrimTrailingChar(&sEntry, c);
					}
					if( sEntry.nByte > 0 ){
						jx9_value_string(pValue, sEntry.zString, (int)sEntry.nByte);
					}
					/* Insert the key and it's value */
					jx9_array_add_elem(pCur, is_array ? 0 /*Automatic index assign */: pWorker, pValue);
				}
			}else{
				while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && ( SyisSpace(zIn[0]) || zIn[0] == '=' ) ){
					zIn++;
				}
			}
			pCur = pOldCur;
		}
	}
	SyHashRelease(&sHash);
	/* Return the parse of the INI string */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}